

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O2

void __thiscall Assimp::glTFExporter::ExportAnimations(glTFExporter *this)

{
  aiAnimation *paVar1;
  aiNodeAnim *nodeChannel;
  uint *puVar2;
  int iVar3;
  ulong uVar4;
  Ref<glTF::Animation> RVar5;
  Ref<glTF::Node> RVar6;
  string name;
  string channelType;
  AnimSampler tmpAnimSampler;
  string nameAnim;
  Ref<glTF::Animation> local_1e8;
  ulong local_1d8;
  ulong local_1d0;
  uint *local_1c8;
  uint *local_1c0;
  uint *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined1 local_190 [48];
  _Alloc_hider local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [96];
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  Ref<glTF::Buffer> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_80.vector =
       &(((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        buffers).mObjs;
  local_80.index = 0;
  for (local_1d8 = 0; local_1d8 < this->mScene->mNumAnimations; local_1d8 = local_1d8 + 1) {
    paVar1 = this->mScene->mAnimations[local_1d8];
    std::__cxx11::string::string((string *)&local_70,"anim",(allocator *)local_120);
    if ((paVar1->mName).length != 0) {
      std::__cxx11::string::assign((char *)&local_70);
    }
    uVar4 = 0;
    while (uVar4 < paVar1->mNumChannels) {
      nodeChannel = paVar1->mChannels[uVar4];
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     &local_70,"_");
      local_1d0 = uVar4;
      to_string<unsigned_int>((string *)local_190,(uint)uVar4);
      std::operator+(&local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190)
      ;
      std::__cxx11::string::~string((string *)local_190);
      std::__cxx11::string::~string((string *)local_120);
      glTF::Asset::FindUniqueID
                ((string *)local_120,
                 (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &local_1b0,"animation");
      std::__cxx11::string::operator=((string *)&local_1b0,(string *)local_120);
      std::__cxx11::string::~string((string *)local_120);
      RVar5 = glTF::LazyDict<glTF::Animation>::Create
                        (&((this->mAsset).
                           super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          animations,local_1b0._M_dataplus._M_p);
      local_1e8.vector = RVar5.vector;
      local_1e8.index = RVar5.index;
      ExtractAnimationData
                ((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &local_1b0,&local_1e8,&local_80,nodeChannel,(float)paVar1->mTicksPerSecond);
      local_1b8 = &nodeChannel->mNumPositionKeys;
      local_1c0 = &nodeChannel->mNumScalingKeys;
      local_1c8 = &nodeChannel->mNumRotationKeys;
      for (iVar3 = 0; iVar3 != 3; iVar3 = iVar3 + 1) {
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        local_140._M_string_length = 0;
        local_140.field_2._M_local_buf[0] = '\0';
        if (iVar3 == 2) {
          std::__cxx11::string::assign((char *)&local_140);
          puVar2 = local_1b8;
        }
        else if (iVar3 == 1) {
          std::__cxx11::string::assign((char *)&local_140);
          puVar2 = local_1c0;
        }
        else {
          std::__cxx11::string::assign((char *)&local_140);
          puVar2 = local_1c8;
        }
        if (0 < (int)*puVar2) {
          local_190._0_8_ = local_190 + 0x10;
          local_190._8_8_ = 0;
          local_190[0x10] = '\0';
          local_190._32_8_ = (vector<glTF::Node_*,_std::allocator<glTF::Node_*>_> *)0x0;
          local_190._40_4_ = 0;
          local_160._M_p = (pointer)&local_150;
          local_158 = 0;
          local_120._0_8_ = local_120 + 0x10;
          local_120._8_8_ = 0;
          local_120[0x10] = '\0';
          local_120._32_8_ = local_120 + 0x30;
          local_120._40_8_ = 0;
          local_120[0x30] = '\0';
          local_120._64_8_ = local_120 + 0x50;
          local_120._72_8_ = 0;
          local_150._M_local_buf[0] = '\0';
          local_120[0x50] = '\0';
          local_c0._M_p = (pointer)&local_b0;
          local_b8 = 0;
          local_b0._M_local_buf[0] = '\0';
          std::operator+(&local_a0,&local_1b0,"_");
          std::operator+(&local_50,&local_a0,&local_140);
          std::__cxx11::string::operator=((string *)local_190,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::_M_assign((string *)&local_160);
          std::__cxx11::string::_M_assign((string *)&local_c0);
          std::operator+(&local_a0,&local_1b0,"_");
          std::operator+(&local_50,&local_a0,&local_140);
          std::__cxx11::string::operator=((string *)local_120,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_a0);
          RVar6 = glTF::LazyDict<glTF::Node>::Get
                            (&((this->mAsset).
                               super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                              nodes,(nodeChannel->mNodeName).data);
          local_190._32_8_ = RVar6.vector;
          local_190._40_4_ = RVar6.index;
          std::__cxx11::string::assign(local_120 + 0x20);
          std::__cxx11::string::assign(local_120 + 0x40);
          std::vector<glTF::Animation::AnimChannel,_std::allocator<glTF::Animation::AnimChannel>_>::
          push_back(&((local_1e8.vector)->
                     super__Vector_base<glTF::Animation_*,_std::allocator<glTF::Animation_*>_>).
                     _M_impl.super__Vector_impl_data._M_start[local_1e8.index]->Channels,
                    (value_type *)local_190);
          std::vector<glTF::Animation::AnimSampler,_std::allocator<glTF::Animation::AnimSampler>_>::
          push_back(&((local_1e8.vector)->
                     super__Vector_base<glTF::Animation_*,_std::allocator<glTF::Animation_*>_>).
                     _M_impl.super__Vector_impl_data._M_start[local_1e8.index]->Samplers,
                    (value_type *)local_120);
          glTF::Animation::AnimSampler::~AnimSampler((value_type *)local_120);
          glTF::Animation::AnimChannel::~AnimChannel((value_type *)local_190);
        }
        std::__cxx11::string::~string((string *)&local_140);
      }
      std::__cxx11::string::~string((string *)&local_1b0);
      uVar4 = local_1d0 + 1;
    }
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void glTFExporter::ExportAnimations()
{
    Ref<Buffer> bufferRef = mAsset->buffers.Get(unsigned (0));

    for (unsigned int i = 0; i < mScene->mNumAnimations; ++i) {
        const aiAnimation* anim = mScene->mAnimations[i];

        std::string nameAnim = "anim";
        if (anim->mName.length > 0) {
            nameAnim = anim->mName.C_Str();
        }

        for (unsigned int channelIndex = 0; channelIndex < anim->mNumChannels; ++channelIndex) {
            const aiNodeAnim* nodeChannel = anim->mChannels[channelIndex];

            // It appears that assimp stores this type of animation as multiple animations.
            // where each aiNodeAnim in mChannels animates a specific node.
            std::string name = nameAnim + "_" + to_string(channelIndex);
            name = mAsset->FindUniqueID(name, "animation");
            Ref<Animation> animRef = mAsset->animations.Create(name);

            /******************* Parameters ********************/
            ExtractAnimationData(*mAsset, name, animRef, bufferRef, nodeChannel, static_cast<float>(anim->mTicksPerSecond));

            for (unsigned int j = 0; j < 3; ++j) {
                std::string channelType;
                int channelSize;
                switch (j) {
                    case 0:
                        channelType = "rotation";
                        channelSize = nodeChannel->mNumRotationKeys;
                        break;
                    case 1:
                        channelType = "scale";
                        channelSize = nodeChannel->mNumScalingKeys;
                        break;
                    case 2:
                        channelType = "translation";
                        channelSize = nodeChannel->mNumPositionKeys;
                        break;
                }

                if (channelSize < 1) { continue; }

                Animation::AnimChannel tmpAnimChannel;
                Animation::AnimSampler tmpAnimSampler;

                tmpAnimChannel.sampler = name + "_" + channelType;
                tmpAnimChannel.target.path = channelType;
                tmpAnimSampler.output = channelType;
                tmpAnimSampler.id = name + "_" + channelType;

                tmpAnimChannel.target.id = mAsset->nodes.Get(nodeChannel->mNodeName.C_Str());

                tmpAnimSampler.input = "TIME";
                tmpAnimSampler.interpolation = "LINEAR";

                animRef->Channels.push_back(tmpAnimChannel);
                animRef->Samplers.push_back(tmpAnimSampler);
            }

        }

        // Assimp documentation staes this is not used (not implemented)
        // for (unsigned int channelIndex = 0; channelIndex < anim->mNumMeshChannels; ++channelIndex) {
        //     const aiMeshAnim* meshChannel = anim->mMeshChannels[channelIndex];
        // }

    } // End: for-loop mNumAnimations
}